

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_http_cookies(Curl_easy *data,connectdata *conn,dynbuf *r)

{
  char *__s;
  curl_trc_feat *pcVar1;
  bool bVar2;
  CURLcode CVar3;
  int iVar4;
  char *pcVar5;
  Curl_llist_node *n;
  void *pvVar6;
  size_t sVar7;
  size_t sVar8;
  char *pcVar9;
  char *pcVar10;
  bool bVar11;
  CURLcode CVar12;
  _Bool secure;
  Curl_llist list;
  int local_80;
  long local_68;
  Curl_llist local_50;
  
  CVar12 = CURLE_OK;
  if (((data->set).str[0x1a] == (char *)0x0) ||
     (pcVar5 = Curl_checkheaders(data,"Cookie",6), pcVar5 != (char *)0x0)) {
    pcVar5 = (char *)0x0;
  }
  else {
    pcVar5 = (data->set).str[0x1a];
  }
  if (data->cookies != (CookieInfo *)0x0 || pcVar5 != (char *)0x0) {
    local_80 = 0;
    if (data->cookies == (CookieInfo *)0x0) {
      bVar11 = false;
      CVar12 = CURLE_OK;
    }
    else {
      bVar11 = false;
      CVar12 = CURLE_OK;
      local_80 = 0;
      if (((data->state).field_0x775 & 8) != 0) {
        pcVar10 = (data->state).aptr.cookiehost;
        if (pcVar10 == (char *)0x0) {
          pcVar10 = (conn->host).name;
        }
        secure = true;
        if ((((conn->handler->protocol & 0x80000002) == 0) &&
            (iVar4 = curl_strequal("localhost",pcVar10), iVar4 == 0)) &&
           (iVar4 = strcmp(pcVar10,"127.0.0.1"), iVar4 != 0)) {
          iVar4 = strcmp(pcVar10,"::1");
          secure = iVar4 == 0;
        }
        Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
        iVar4 = Curl_cookie_getlist(data,data->cookies,pcVar10,(data->state).up.path,secure,
                                    &local_50);
        Curl_share_unlock(data,CURL_LOCK_DATA_COOKIE);
        local_80 = 0;
        bVar11 = false;
        CVar12 = CURLE_OK;
        if (iVar4 == 0) {
          n = Curl_llist_head(&local_50);
          if (n == (Curl_llist_node *)0x0) {
            local_80 = 0;
            bVar11 = false;
          }
          else {
            local_68 = 8;
            CVar12 = CURLE_OK;
            bVar11 = false;
            local_80 = 0;
            do {
              pvVar6 = Curl_node_elem(n);
              bVar2 = true;
              if (*(long *)((long)pvVar6 + 0x48) != 0) {
                CVar3 = CVar12;
                if (local_80 == 0) {
                  CVar12 = Curl_dyn_addn(r,"Cookie: ",8);
                  CVar3 = CURLE_OK;
                  if (CVar12 != CURLE_OK) {
                    bVar2 = false;
                    local_80 = 0;
                    goto LAB_00135f10;
                  }
                }
                CVar12 = CVar3;
                pcVar10 = *(char **)((long)pvVar6 + 0x40);
                sVar7 = strlen(pcVar10);
                __s = *(char **)((long)pvVar6 + 0x48);
                sVar8 = strlen(__s);
                if (sVar8 + sVar7 + local_68 + 1 < 0x1ffe) {
                  pcVar9 = "; ";
                  if (local_80 == 0) {
                    pcVar9 = "";
                  }
                  CVar12 = Curl_dyn_addf(r,"%s%s=%s",pcVar9,pcVar10,__s);
                  if (CVar12 == CURLE_OK) {
                    local_68 = local_68 + (ulong)(local_80 != 0) * 2 + sVar7 + sVar8 + 1;
                    local_80 = local_80 + 1;
                    CVar12 = CURLE_OK;
                    bVar2 = true;
                  }
                  else {
                    bVar2 = false;
                  }
                }
                else if (data == (Curl_easy *)0x0) {
                  bVar11 = true;
                  bVar2 = false;
                }
                else {
                  bVar11 = true;
                  if ((((data->set).field_0x8cd & 0x10) != 0) &&
                     ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 ||
                      (0 < pcVar1->log_level)))) {
                    Curl_infof(data,
                               "Restricted outgoing cookies due to header size, \'%s\' not sent",
                               pcVar10);
                  }
                  bVar2 = false;
                }
              }
LAB_00135f10:
            } while ((bVar2) && (n = Curl_node_next(n), n != (Curl_llist_node *)0x0));
          }
          Curl_llist_destroy(&local_50,(void *)0x0);
        }
      }
    }
    if ((CVar12 == CURLE_OK && pcVar5 != (char *)0x0) && !bVar11) {
      CVar12 = CURLE_OK;
      if (local_80 == 0) {
        CVar12 = Curl_dyn_addn(r,"Cookie: ",8);
      }
      if (CVar12 == CURLE_OK) {
        pcVar10 = "; ";
        if (local_80 == 0) {
          pcVar10 = "";
        }
        CVar12 = Curl_dyn_addf(r,"%s%s",pcVar10,pcVar5);
        local_80 = local_80 + 1;
      }
    }
    if ((local_80 != 0) && (CVar12 == CURLE_OK)) {
      CVar12 = Curl_dyn_addn(r,"\r\n",2);
    }
  }
  return CVar12;
}

Assistant:

CURLcode Curl_http_cookies(struct Curl_easy *data,
                           struct connectdata *conn,
                           struct dynbuf *r)
{
  CURLcode result = CURLE_OK;
  char *addcookies = NULL;
  bool linecap = FALSE;
  if(data->set.str[STRING_COOKIE] &&
     !Curl_checkheaders(data, STRCONST("Cookie")))
    addcookies = data->set.str[STRING_COOKIE];

  if(data->cookies || addcookies) {
    struct Curl_llist list;
    int count = 0;
    int rc = 1;

    if(data->cookies && data->state.cookie_engine) {
      const char *host = data->state.aptr.cookiehost ?
        data->state.aptr.cookiehost : conn->host.name;
      const bool secure_context =
        conn->handler->protocol&(CURLPROTO_HTTPS|CURLPROTO_WSS) ||
        strcasecompare("localhost", host) ||
        !strcmp(host, "127.0.0.1") ||
        !strcmp(host, "::1") ? TRUE : FALSE;
      Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);
      rc = Curl_cookie_getlist(data, data->cookies, host, data->state.up.path,
                               secure_context, &list);
      Curl_share_unlock(data, CURL_LOCK_DATA_COOKIE);
    }
    if(!rc) {
      struct Curl_llist_node *n;
      size_t clen = 8; /* hold the size of the generated Cookie: header */

      /* loop through all cookies that matched */
      for(n = Curl_llist_head(&list); n; n = Curl_node_next(n)) {
        struct Cookie *co = Curl_node_elem(n);
        if(co->value) {
          size_t add;
          if(!count) {
            result = Curl_dyn_addn(r, STRCONST("Cookie: "));
            if(result)
              break;
          }
          add = strlen(co->name) + strlen(co->value) + 1;
          if(clen + add >= MAX_COOKIE_HEADER_LEN) {
            infof(data, "Restricted outgoing cookies due to header size, "
                  "'%s' not sent", co->name);
            linecap = TRUE;
            break;
          }
          result = Curl_dyn_addf(r, "%s%s=%s", count ? "; " : "",
                                 co->name, co->value);
          if(result)
            break;
          clen += add + (count ? 2 : 0);
          count++;
        }
      }
      Curl_llist_destroy(&list, NULL);
    }
    if(addcookies && !result && !linecap) {
      if(!count)
        result = Curl_dyn_addn(r, STRCONST("Cookie: "));
      if(!result) {
        result = Curl_dyn_addf(r, "%s%s", count ? "; " : "", addcookies);
        count++;
      }
    }
    if(count && !result)
      result = Curl_dyn_addn(r, STRCONST("\r\n"));

    if(result)
      return result;
  }
  return result;
}